

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::MapReferencedPropertyIds(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  int iVar1;
  ReferencedPropertyIdMap *pRVar2;
  Type pSVar3;
  uint uVar4;
  FunctionBody *this_00;
  int iVar5;
  ulong uVar6;
  
  this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
  Js::FunctionBody::CreateReferencedPropertyIdMap(this_00,funcInfo->referencedPropertyIdCount);
  pRVar2 = funcInfo->referencedPropertyIdToMapIndex;
  uVar4 = pRVar2->bucketCount;
  if (uVar4 != 0) {
    uVar6 = 0;
    do {
      iVar5 = pRVar2->buckets[uVar6];
      if (pRVar2->buckets[uVar6] != -1) {
        do {
          pSVar3 = pRVar2->entries;
          iVar1 = pSVar3[iVar5].
                  super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<int,_unsigned_int>.
                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                  .super_KeyValueEntryDataLayout2<int,_unsigned_int>.next;
          Js::FunctionBody::SetReferencedPropertyIdWithMapIndex
                    (this_00,pSVar3[iVar5].
                             super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .super_KeyValueEntry<int,_unsigned_int>.
                             super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                             .super_KeyValueEntryDataLayout2<int,_unsigned_int>.value,
                     pSVar3[iVar5].
                     super_DefaultHashedEntry<int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<int,_unsigned_int>.
                     super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_unsigned_int>_>
                     .super_KeyValueEntryDataLayout2<int,_unsigned_int>.key);
          iVar5 = iVar1;
        } while (iVar1 != -1);
        uVar4 = pRVar2->bucketCount;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar4);
  }
  Js::FunctionBody::VerifyReferencedPropertyIdMap(this_00);
  return;
}

Assistant:

void ByteCodeGenerator::MapReferencedPropertyIds(FuncInfo * funcInfo)
{
    Js::FunctionBody *functionBody = funcInfo->GetParsedFunctionBody();
    uint referencedPropertyIdCount = funcInfo->GetReferencedPropertyIdCount();
    functionBody->CreateReferencedPropertyIdMap(referencedPropertyIdCount);

    funcInfo->referencedPropertyIdToMapIndex->Map([functionBody](Js::PropertyId propertyId, uint mapIndex)
    {
        functionBody->SetReferencedPropertyIdWithMapIndex(mapIndex, propertyId);
    });

#if DBG
    functionBody->VerifyReferencedPropertyIdMap();
#endif
}